

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O3

lysp_restr * lysp_node_musts(lysp_node *node)

{
  lysp_restr **pplVar1;
  lysp_restr *plVar2;
  
  pplVar1 = lysp_node_musts_p(node);
  if (pplVar1 == (lysp_restr **)0x0) {
    plVar2 = (lysp_restr *)0x0;
  }
  else {
    plVar2 = *pplVar1;
  }
  return plVar2;
}

Assistant:

struct lysp_restr *
lysp_node_musts(const struct lysp_node *node)
{
    struct lysp_restr **musts;

    musts = lysp_node_musts_p(node);
    if (musts) {
        return *musts;
    } else {
        return NULL;
    }
}